

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_length<char16_t,char>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  jessilib *pjVar1;
  long lVar2;
  char32_t cVar3;
  char16_t *pcVar4;
  size_t sVar5;
  jessilib *this;
  char *pcVar6;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  size_t local_38;
  
  pcVar6 = in_prefix._M_str;
  pjVar1 = (jessilib *)in_prefix._M_len;
  pcVar4 = in_string._M_str;
  sVar5 = in_string._M_len;
  local_38 = 0;
  this = pjVar1;
  while( true ) {
    if ((sVar5 == 0) || (this == (jessilib *)0x0)) {
      sVar5 = 0;
      if (this == (jessilib *)0x0) {
        sVar5 = local_38;
      }
      return sVar5;
    }
    cVar3 = (char32_t)(ushort)*pcVar4;
    lVar2 = 1;
    if (((sVar5 != 1) && ((cVar3 & 0xfc00U) == 0xd800)) && (((ushort)pcVar4[1] & 0xfc00) == 0xdc00))
    {
      cVar3 = (uint)(ushort)*pcVar4 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
      lVar2 = 2;
    }
    in_string_00._M_str = (char *)pjVar1;
    in_string_00._M_len = (size_t)pcVar6;
    dVar7 = decode_codepoint_utf8<char>(this,in_string_00);
    pjVar1 = (jessilib *)dVar7.units;
    if (cVar3 != dVar7.codepoint || pjVar1 == (jessilib *)0x0) break;
    pcVar4 = pcVar4 + lVar2;
    sVar5 = sVar5 - lVar2;
    pcVar6 = pcVar6 + (long)pjVar1;
    this = this + -(long)pjVar1;
    local_38 = local_38 + lVar2;
  }
  return 0;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}